

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall just::test::test_manager::add(test_manager *this,string *name_,_func_void *f_)

{
  test_case local_48;
  _func_void *local_20;
  _func_void *f__local;
  string *name__local;
  test_manager *this_local;
  
  local_20 = f_;
  f__local = (_func_void *)name_;
  name__local = (string *)this;
  test_case::test_case(&local_48,name_,f_);
  std::vector<just::test::test_case,_std::allocator<just::test::test_case>_>::push_back
            (&this->_cases,&local_48);
  test_case::~test_case(&local_48);
  return;
}

Assistant:

void add(const std::string& name_, void (*f_)())
      {
        _cases.push_back(test_case(name_, f_));
      }